

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::InternReadFile
          (LWOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_01;
  pointer pSVar1;
  pointer pSVar2;
  iterator __position;
  uint *puVar3;
  _List_node_base *p_Var4;
  long lVar5;
  undefined4 *puVar6;
  undefined8 uVar7;
  pointer pcVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  LWOImporter *pLVar12;
  SortedRep *sorted;
  pointer pvVar13;
  aiScene *paVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  const_iterator __cbeg;
  undefined4 extraout_var;
  _Node *p_Var18;
  Logger *pLVar19;
  aiMesh *paVar20;
  ulong *puVar21;
  aiVector3D *paVar22;
  aiColor4D *__s;
  SurfaceList *pSVar23;
  aiNode *paVar24;
  uint *puVar25;
  mapped_type *ppaVar26;
  aiMaterial **ppaVar27;
  aiMaterial *this_02;
  aiMesh **__dest;
  runtime_error *prVar28;
  long *plVar29;
  uint uVar30;
  _List_node_base *p_Var31;
  long lVar32;
  aiFace *paVar33;
  _List_node_base *p_Var34;
  pointer pSVar35;
  pointer paVar36;
  pointer paVar37;
  uint mui_1;
  pointer __src;
  char *message;
  size_type __n;
  ulong uVar38;
  uint w_1;
  uint w;
  uint mui;
  ulong uVar39;
  ulong uVar40;
  pointer ppaVar41;
  _List_node_base *p_Var42;
  aiMesh *mesh;
  uint i;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcMeshes;
  SurfaceList _mSurfaces;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  pSorted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer;
  aiColor4D *pvVC [8];
  TagMappingTable _mMapping;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  apcNodes;
  LayerList _mLayers;
  aiVector3D *pvUV [8];
  uint vVColorIndices [8];
  uint vUVChannelIndices [8];
  TagList _mTags;
  aiMesh *local_378;
  LWOImporter *local_370;
  uint local_364;
  _List_node_base *local_360;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_358;
  aiMesh *local_340;
  uint local_334;
  aiColor4D *local_330;
  _List_node_base **local_328;
  ulong local_320;
  aiNode *local_318;
  value_type_conflict1 local_30c;
  _List_node_base *local_308;
  long local_300;
  SortedRep *local_2f8;
  aiFace *local_2f0;
  undefined1 local_2e8 [16];
  pointer local_2d8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [2];
  undefined1 local_258 [16];
  pointer local_248;
  aiScene *local_240;
  uint *local_238;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  local_230;
  _List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> local_200;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [8];
  undefined **local_158;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint local_130;
  _List_node_base local_128;
  undefined1 local_118 [16];
  uint local_108;
  _Bit_type *local_100;
  uint local_f8;
  _List_node_base *local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 auStack_a0 [24];
  uint local_88 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  paVar37 = (pointer)(local_1e8 + 0x10);
  local_1e8._0_8_ = paVar37;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"rb","");
  iVar15 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1e8._0_8_);
  plVar29 = (long *)CONCAT44(extraout_var,iVar15);
  if ((pointer)local_1e8._0_8_ != paVar37) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8[0]._M_allocated_capacity + 1));
  }
  if (plVar29 == (long *)0x0) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_298,"Failed to open LWO file ",pFile);
    plVar29 = (long *)std::__cxx11::string::append((char *)local_298);
    local_1e8._0_8_ = *plVar29;
    paVar36 = (pointer)(plVar29 + 2);
    if ((pointer)local_1e8._0_8_ == paVar36) {
      local_1d8[0]._0_8_ = *(undefined8 *)paVar36;
      local_1d8[0]._8_8_ = plVar29[3];
      local_1e8._0_8_ = paVar37;
    }
    else {
      local_1d8[0]._0_8_ = *(undefined8 *)paVar36;
    }
    local_1e8._8_8_ = plVar29[1];
    *plVar29 = (long)paVar36;
    plVar29[1] = 0;
    *(undefined1 *)(plVar29 + 2) = 0;
    std::runtime_error::runtime_error(prVar28,(string *)local_1e8);
    *(undefined ***)prVar28 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar16 = (**(code **)(*plVar29 + 0x30))(plVar29);
  this->fileSize = uVar16;
  if (uVar16 < 0xc) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = paVar37;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"LWO: The file is too small to contain the IFF header","");
    std::runtime_error::runtime_error(prVar28,(string *)local_1e8);
    *(undefined ***)prVar28 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_2b0,(ulong)uVar16,(allocator_type *)local_1e8);
  (**(code **)(*plVar29 + 0x10))
            (plVar29,local_2b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,1,this->fileSize);
  this->pScene = pScene;
  local_240 = pScene;
  if (*(int *)local_2b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 0x4d524f46) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"The file is not an IFF file: FORM chunk is missing","");
    std::runtime_error::runtime_error(prVar28,(string *)local_1e8);
    *(undefined ***)prVar28 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar16 = *(uint *)((long)local_2b0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + 8);
  this->mFileBuffer =
       (uint8_t *)
       ((long)local_2b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 0xc);
  this->fileSize = this->fileSize - 0xc;
  this->hasNamedLayer = false;
  local_200._M_impl._M_node._M_size = 0;
  local_2d8 = (pointer)0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  local_48 = (undefined1  [16])0x0;
  local_248 = (pointer)0x0;
  local_258 = (undefined1  [16])0x0;
  this->mLayers = (LayerList *)&local_200;
  this->mTags = (TagList *)local_48;
  this->mMapping = (TagMappingTable *)local_258;
  this->mSurfaces = (SurfaceList *)local_2e8;
  local_200._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_200;
  local_200._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_200;
  memset((Layer *)local_1e8,0,0x90);
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_130 = 3;
  local_100 = (_Bit_type *)0x0;
  local_f8 = 0;
  local_f0 = (_List_node_base *)0x0;
  local_128._M_next = (_List_node_base *)0x0;
  local_128._M_prev = (_List_node_base *)0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = 0;
  local_158 = &PTR__VMapEntry_0080f1f8;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_c8._0_2_ = 0;
  local_c8._2_2_ = 0xffff;
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  auStack_a0._8_4_ = 0.0;
  auStack_a0[0xc] = false;
  auStack_a0._0_5_ = 0;
  auStack_a0._5_3_ = 0;
  local_150._M_p = (pointer)&local_140;
  p_Var18 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::
            _M_create_node<Assimp::LWO::Layer>
                      ((list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)&local_200,
                       (Layer *)local_1e8);
  std::__detail::_List_node_base::_M_hook(&p_Var18->super__List_node_base);
  local_200._M_impl._M_node._M_size = local_200._M_impl._M_node._M_size + 1;
  LWO::Layer::~Layer((Layer *)local_1e8);
  p_Var34 = (this->mLayers->
            super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>)._M_impl.
            _M_node.super__List_node_base._M_prev;
  this->mCurLayer = (Layer *)(p_Var34 + 1);
  std::__cxx11::string::_M_replace
            ((ulong)&p_Var34[0x13]._M_prev,0,(char *)p_Var34[0x14]._M_next,0x6c438c);
  this->mCurLayer->mIndex = 0xffff;
  uVar30 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  if (uVar30 == 0x4c574f32) {
    this->mIsLXOB = false;
    pLVar19 = DefaultLogger::get();
    message = "LWO file format: LWO2 (>= LightWave 6)";
  }
  else {
    if (uVar30 != 0x4c584f42) {
      if (uVar30 != 0x4c574f42) {
        local_230._M_impl._0_1_ = SUB41(uVar16,0);
        local_230._M_impl._1_1_ = SUB41((uVar16 & 0xff00) >> 8,0);
        local_230._M_impl._2_1_ = SUB41((uVar16 & 0xff0000) >> 0x10,0);
        local_230._M_impl._3_1_ = SUB41(uVar16 >> 0x18,0);
        local_230._M_impl._4_1_ = 0;
        prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_298[0]._M_dataplus._M_p = (pointer)&local_298[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,"Unknown LWO sub format: ","");
        plVar29 = (long *)std::__cxx11::string::append((char *)local_298);
        local_1e8._0_8_ = *plVar29;
        paVar37 = (pointer)(plVar29 + 2);
        if ((pointer)local_1e8._0_8_ == paVar37) {
          local_1d8[0]._0_8_ = *(undefined8 *)paVar37;
          local_1d8[0]._8_8_ = plVar29[3];
          local_1e8._0_8_ = (pointer)(local_1e8 + 0x10);
        }
        else {
          local_1d8[0]._0_8_ = *(undefined8 *)paVar37;
        }
        local_1e8._8_8_ = plVar29[1];
        *plVar29 = (long)paVar37;
        plVar29[1] = 0;
        *(undefined1 *)(plVar29 + 2) = 0;
        std::runtime_error::runtime_error(prVar28,(string *)local_1e8);
        *(undefined ***)prVar28 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pLVar19 = DefaultLogger::get();
      Logger::info(pLVar19,"LWO file format: LWOB (<= LightWave 5.5)");
      this->mIsLWO2 = false;
      this->mIsLXOB = false;
      LoadLWOBFile(this);
      goto LAB_00446104;
    }
    this->mIsLXOB = true;
    pLVar19 = DefaultLogger::get();
    message = "LWO file format: LXOB (Modo)";
  }
  Logger::info(pLVar19,message);
  this->mIsLWO2 = true;
  LoadLWO2File(this);
  if (this->configLayerIndex != 0xffffffff) {
    p_Var34 = (_List_node_base *)this->mLayers;
    p_Var31 = p_Var34->_M_next;
    if (p_Var31 == p_Var34) {
LAB_00446ecf:
      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1e8._0_8_ = local_1e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"LWO2: The requested layer was not found","");
      std::runtime_error::runtime_error(prVar28,(string *)local_1e8);
      *(undefined ***)prVar28 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar15 = 0;
    do {
      iVar15 = iVar15 + (*(byte *)((long)&(p_Var31 + 0x15)[1]._M_next + 4) ^ 1);
      p_Var31 = (((_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                 &p_Var31->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var31 != p_Var34);
    if (iVar15 != 2) goto LAB_00446ecf;
  }
  if (((this->configLayerName)._M_string_length != 0) && (this->hasNamedLayer == false)) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   "LWO2: Unable to find the requested layer: ",&this->configLayerName);
    std::runtime_error::runtime_error(prVar28,(string *)local_1e8);
    *(undefined ***)prVar28 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00446104:
  ResolveTags(this);
  ResolveClips(this);
  local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __n = 0;
  local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_230._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_230._M_impl.super__Rb_tree_header._M_header;
  local_230._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_230._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (((int)((ulong)((long)(this->mSurfaces->
                           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mSurfaces->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3e7063e7 &
      0xfffffffeU) != 0) {
    __n = (this->mLayers->super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>)
          ._M_impl._M_node._M_size;
  }
  local_230._M_impl.super__Rb_tree_header._M_header._M_right =
       local_230._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_358,__n);
  p_Var34 = (_List_node_base *)this->mLayers;
  p_Var31 = p_Var34->_M_next;
  local_370 = this;
  if (p_Var31 != p_Var34) {
    local_334 = 0xffffffff;
    local_308 = p_Var34;
    do {
      if (*(undefined1 *)((long)&p_Var31[0x16]._M_next + 4) == '\0') {
        local_318 = (aiNode *)(p_Var31 + 1);
        lVar32 = (long)local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        local_300 = lVar32;
        if ((p_Var31[0x11]._M_next != p_Var31[0x11]._M_prev) &&
           (p_Var31[1]._M_next != p_Var31[1]._M_prev)) {
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::vector(&local_2c8,
                   ((long)(local_370->mSurfaces->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_370->mSurfaces->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7 + 1
                   ,(allocator_type *)local_1e8);
          local_364 = 0;
          p_Var34 = p_Var31[0x11]._M_next;
          p_Var42 = p_Var31[0x11]._M_prev;
          uVar16 = local_334;
          p_Var4 = p_Var42;
          if (p_Var34 != p_Var42) {
            do {
              local_360 = p_Var4;
              iVar15 = *(int *)&p_Var34[1]._M_prev;
              if (iVar15 < 0x50544348) {
                if ((iVar15 == 0x424f4e45) || (iVar15 == 0x46414345)) {
LAB_00446297:
                  uVar30 = *(uint *)&p_Var34[1]._M_next;
                  if ((ulong)uVar30 <
                      (ulong)((long)(local_370->mTags->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_370->mTags->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                    if (uVar30 == 0xffffffff) goto LAB_004462e6;
                    uVar17 = *(uint *)(local_258._0_8_ + (ulong)uVar30 * 4);
                    if (*(uint *)(local_258._0_8_ + (ulong)uVar30 * 4) == 0xffffffff)
                    goto LAB_004462e6;
                  }
                  else {
                    pLVar19 = DefaultLogger::get();
                    Logger::warn(pLVar19,"LWO: Invalid face surface index");
LAB_004462e6:
                    uVar17 = uVar16;
                    if (uVar16 == 0xffffffff) {
                      this_01 = local_370->mSurfaces;
                      pSVar35 = (this_01->
                                super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
                      pSVar1 = (this_01->
                               super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      LWO::Surface::Surface((Surface *)local_1e8);
                      std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
                      emplace_back<Assimp::LWO::Surface>(this_01,(Surface *)local_1e8);
                      LWO::Surface::~Surface((Surface *)local_1e8);
                      pSVar2 = (local_370->mSurfaces->
                               super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                      pSVar2[-1].mColor.b = 0.6;
                      pSVar2[-1].mColor.r = 0.6;
                      pSVar2[-1].mColor.g = 0.6;
                      std::__cxx11::string::_M_replace
                                ((ulong)(pSVar2 + -1),0,(char *)pSVar2[-1].mName._M_string_length,
                                 0x6c4492);
                      uVar16 = (int)((ulong)((long)pSVar35 - (long)pSVar1) >> 3) * -0x3e7063e7;
                      p_Var42 = local_360;
                      uVar17 = uVar16;
                    }
                  }
                  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                            (local_2c8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar17);
                  __position._M_current = *(uint **)(this_00 + 8);
                  if (__position._M_current == *(uint **)(this_00 + 0x10)) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_364);
                  }
                  else {
                    *__position._M_current = local_364;
                    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
                  }
                }
              }
              else if ((iVar15 == 0x53554244) || (iVar15 == 0x50544348)) goto LAB_00446297;
              p_Var34 = p_Var34 + 2;
              local_364 = local_364 + 1;
              p_Var4 = local_360;
            } while (p_Var34 != p_Var42);
          }
          local_334 = uVar16;
          if (uVar16 == 0xffffffff) {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::_M_erase(&local_2c8,
                       local_2c8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
          }
          pSVar23 = local_370->mSurfaces;
          pSVar35 = (pSVar23->
                    super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pSVar23->
              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
              _M_impl.super__Vector_impl_data._M_finish != pSVar35) {
            local_328 = &p_Var31[2]._M_prev;
            uVar40 = 0;
            do {
              pvVar13 = local_2c8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_2c8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar40].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_2c8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar40].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_320 = uVar40;
                paVar20 = (aiMesh *)operator_new(0x520);
                paVar20->mPrimitiveTypes = 0;
                paVar20->mNumVertices = 0;
                paVar20->mNumFaces = 0;
                memset(&paVar20->mVertices,0,0xcc);
                paVar20->mBones = (aiBone **)0x0;
                paVar20->mMaterialIndex = 0;
                (paVar20->mName).length = 0;
                (paVar20->mName).data[0] = '\0';
                memset((paVar20->mName).data + 1,0x1b,0x3ff);
                paVar20->mNumAnimMeshes = 0;
                paVar20->mAnimMeshes = (aiAnimMesh **)0x0;
                paVar20->mMethod = 0;
                (paVar20->mAABB).mMin.x = 0.0;
                *(undefined1 (*) [16])&(paVar20->mAABB).mMin.y = (undefined1  [16])0x0;
                (paVar20->mAABB).mMax.z = 0.0;
                memset(paVar20->mColors,0,0xa0);
                local_378 = paVar20;
                if (local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_358,
                             (iterator)
                             local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_378);
                }
                else {
                  *local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish = paVar20;
                  local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                paVar20 = local_378;
                local_2f8 = pvVar13 + uVar40;
                local_378->mNumFaces =
                     (uint)((ulong)((long)(local_2f8->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_2f8->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 2);
                puVar3 = (local_2f8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                for (puVar25 = (local_2f8->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start; puVar25 != puVar3;
                    puVar25 = puVar25 + 1) {
                  local_378->mNumVertices =
                       local_378->mNumVertices +
                       *(int *)&p_Var31[0x11]._M_next[(ulong)*puVar25 * 2]._M_next;
                }
                uVar16 = local_378->mNumVertices;
                uVar40 = (ulong)uVar16 * 0xc;
                local_360 = (_List_node_base *)operator_new__(uVar40);
                if (uVar16 != 0) {
                  memset(local_360,0,((uVar40 - 0xc) / 0xc) * 0xc + 0xc);
                }
                paVar20->mVertices = (aiVector3D *)local_360;
                uVar39 = (ulong)paVar20->mNumFaces;
                puVar21 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
                sorted = local_2f8;
                paVar24 = local_318;
                uVar40 = local_320;
                pLVar12 = local_370;
                *puVar21 = uVar39;
                local_2f0 = (aiFace *)(puVar21 + 1);
                if (uVar39 != 0) {
                  paVar33 = local_2f0;
                  do {
                    paVar33->mNumIndices = 0;
                    paVar33->mIndices = (uint *)0x0;
                    paVar33 = paVar33 + 1;
                  } while (paVar33 != local_2f0 + uVar39);
                }
                paVar20->mFaces = local_2f0;
                paVar20->mMaterialIndex = (uint)local_320;
                local_88[8] = 0xffffffff;
                local_88[9] = 0xffffffff;
                local_88[10] = 0xffffffff;
                local_88[0xb] = 0xffffffff;
                local_88[0xc] = 0xffffffff;
                local_88[0xd] = 0xffffffff;
                local_88[0xe] = 0xffffffff;
                local_88[0xf] = 0xffffffff;
                local_88[0] = 0xffffffff;
                local_88[1] = 0xffffffff;
                local_88[2] = 0xffffffff;
                local_88[3] = 0xffffffff;
                local_88[4] = 0xffffffff;
                local_88[5] = 0xffffffff;
                local_88[6] = 0xffffffff;
                local_88[7] = 0xffffffff;
                local_238 = puVar3;
                FindUVChannels(local_370,(Surface *)(local_2e8._0_8_ + local_320 * 0x148),local_2f8,
                               (Layer *)local_318,local_88 + 8);
                FindVCChannels(pLVar12,(Surface *)(local_2e8._0_8_ + uVar40 * 0x148),sorted,
                               (Layer *)paVar24,local_88);
                lVar32 = 0;
                do {
                  if (local_88[lVar32 + 8] == 0xffffffff) break;
                  local_340 = local_378;
                  uVar16 = local_378->mNumVertices;
                  uVar39 = (ulong)uVar16 * 0xc;
                  paVar22 = (aiVector3D *)operator_new__(uVar39);
                  if (uVar16 != 0) {
                    memset(paVar22,0,((uVar39 - 0xc) / 0xc) * 0xc + 0xc);
                  }
                  local_340->mTextureCoords[lVar32] = paVar22;
                  *(aiVector3D **)(local_1e8 + lVar32 * 8) = paVar22;
                  local_378->mNumUVComponents[0] = 2;
                  lVar32 = lVar32 + 1;
                } while (lVar32 != 8);
                if (p_Var31[0xb]._M_next == (_List_node_base *)0x0) {
                  paVar22 = (aiVector3D *)0x0;
                }
                else {
                  local_340 = local_378;
                  uVar16 = local_378->mNumVertices;
                  uVar39 = (ulong)uVar16 * 0xc;
                  paVar22 = (aiVector3D *)operator_new__(uVar39);
                  if (uVar16 != 0) {
                    memset(paVar22,0,((uVar39 - 0xc) / 0xc) * 0xc + 0xc);
                  }
                  local_340->mNormals = paVar22;
                }
                lVar32 = 0;
                do {
                  if (local_88[lVar32] == 0xffffffff) break;
                  local_340 = local_378;
                  local_330 = (aiColor4D *)(ulong)local_378->mNumVertices;
                  uVar39 = (long)local_330 << 4;
                  __s = (aiColor4D *)operator_new__(uVar39);
                  if ((int)local_330 != 0) {
                    local_330 = __s;
                    memset(__s,0,uVar39);
                    __s = local_330;
                  }
                  local_340->mColors[lVar32] = __s;
                  (&local_298[0]._M_dataplus)[lVar32]._M_p = (pointer)__s;
                  lVar32 = lVar32 + 1;
                } while (lVar32 != 8);
                if (p_Var31[2]._M_prev != p_Var31[3]._M_next) {
                  p_Var31[3]._M_next = p_Var31[2]._M_prev;
                }
                local_30c = 0;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328,
                           (ulong)local_378->mNumFaces,&local_30c);
                puVar25 = (local_2f8->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if (puVar25 != local_238) {
                  p_Var34 = *local_328;
                  iVar15 = 0;
                  do {
                    uVar39 = (ulong)*puVar25;
                    p_Var4 = p_Var31[0x11]._M_next;
                    p_Var42 = p_Var4 + uVar39 * 2;
                    *(undefined4 *)&p_Var34->_M_next =
                         *(undefined4 *)((long)&p_Var4[uVar39 * 2 + 1]._M_next + 4);
                    if (*(int *)&p_Var4[uVar39 * 2]._M_next != 0) {
                      uVar39 = 0;
                      do {
                        uVar38 = (ulong)*(uint *)((long)&p_Var42->_M_prev->_M_next + uVar39 * 4);
                        lVar32 = *(long *)&local_318->mName;
                        *(undefined4 *)&local_360->_M_prev =
                             *(undefined4 *)(lVar32 + 8 + uVar38 * 0xc);
                        local_360->_M_next = *(_List_node_base **)(lVar32 + uVar38 * 0xc);
                        local_360 = (_List_node_base *)((long)&local_360->_M_prev + 4);
                        lVar32 = 0;
                        do {
                          if ((ulong)local_88[lVar32 + 8] == 0xffffffff) break;
                          lVar5 = (long)p_Var31[8]._M_prev[(ulong)local_88[lVar32 + 8] * 7 + 3].
                                        _M_next;
                          puVar6 = *(undefined4 **)(local_1e8 + lVar32 * 8);
                          *puVar6 = *(undefined4 *)(lVar5 + uVar38 * 8);
                          puVar6[1] = *(undefined4 *)(lVar5 + 4 + uVar38 * 8);
                          *(undefined4 **)(local_1e8 + lVar32 * 8) = puVar6 + 3;
                          lVar32 = lVar32 + 1;
                        } while (lVar32 != 8);
                        if (paVar22 == (aiVector3D *)0x0) {
                          paVar22 = (aiVector3D *)0x0;
                        }
                        else {
                          p_Var4 = p_Var31[0xd]._M_next;
                          paVar22->z = *(float *)((long)&p_Var4->_M_prev + uVar38 * 0xc);
                          uVar7 = *(undefined8 *)((long)&p_Var4->_M_next + uVar38 * 0xc);
                          paVar22->x = (float)(int)uVar7;
                          paVar22->y = (float)(int)((ulong)uVar7 >> 0x20);
                          paVar22->z = -paVar22->z;
                          paVar22 = paVar22 + 1;
                        }
                        lVar32 = 0;
                        do {
                          if ((ulong)local_88[lVar32] == 0xffffffff) break;
                          pcVar8 = (&local_298[0]._M_dataplus)[lVar32]._M_p;
                          puVar6 = (undefined4 *)
                                   ((long)p_Var31[7]._M_next[(ulong)local_88[lVar32] * 7 + 3].
                                          _M_next + uVar38 * 0x10);
                          uVar9 = puVar6[1];
                          uVar10 = puVar6[2];
                          uVar11 = puVar6[3];
                          *(undefined4 *)pcVar8 = *puVar6;
                          *(undefined4 *)(pcVar8 + 4) = uVar9;
                          *(undefined4 *)(pcVar8 + 8) = uVar10;
                          *(undefined4 *)(pcVar8 + 0xc) = uVar11;
                          if (((pointer)(local_2e8._0_8_ + uVar40 * 0x148))->mVCMapType ==
                              0x52474220) {
                            pcVar8[0xc] = '\0';
                            pcVar8[0xd] = '\0';
                            pcVar8[0xe] = -0x80;
                            pcVar8[0xf] = '?';
                          }
                          (&local_298[0]._M_dataplus)[lVar32]._M_p = pcVar8 + 0x10;
                          lVar32 = lVar32 + 1;
                        } while (lVar32 != 8);
                        *(int *)((long)&p_Var42->_M_prev->_M_next + uVar39 * 4) = iVar15;
                        uVar39 = uVar39 + 1;
                        iVar15 = iVar15 + 1;
                      } while (uVar39 < *(uint *)&p_Var42->_M_next);
                    }
                    local_2f0->mIndices = (uint *)p_Var42->_M_prev;
                    local_2f0->mNumIndices = *(uint *)&p_Var42->_M_next;
                    p_Var42->_M_prev = (_List_node_base *)0x0;
                    local_2f0 = local_2f0 + 1;
                    puVar25 = puVar25 + 1;
                    p_Var34 = (_List_node_base *)((long)&p_Var34->_M_next + 4);
                  } while (puVar25 != local_238);
                }
                if (local_378->mNormals == (aiVector3D *)0x0) {
                  ComputeNormals(local_370,local_378,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328,
                                 (Surface *)(local_2e8._0_8_ + uVar40 * 0x148));
                  uVar40 = local_320;
                }
                else {
                  pLVar19 = DefaultLogger::get();
                  uVar40 = local_320;
                  Logger::debug(pLVar19,"LWO2: No need to compute normals, they\'re already there");
                }
                pSVar23 = local_370->mSurfaces;
                pSVar35 = (pSVar23->
                          super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              }
              uVar40 = (ulong)((int)uVar40 + 1);
              uVar39 = ((long)(pSVar23->
                              super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar35 >> 3) *
                       -0x7063e7063e7063e7;
            } while (uVar40 <= uVar39 && uVar39 - uVar40 != 0);
          }
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_2c8);
          lVar32 = (long)local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          p_Var34 = local_308;
        }
        uVar40 = lVar32 - local_300;
        iVar15 = std::__cxx11::string::compare((char *)&p_Var31[0x13]._M_prev);
        uVar16 = (uint)uVar40;
        if (iVar15 != 0 || uVar16 != 0) {
          paVar24 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar24);
          p_Var34 = p_Var31[0x14]._M_next;
          if (p_Var34 < (_List_node_base *)0x400) {
            (paVar24->mName).length = (ai_uint32)p_Var34;
            memcpy((paVar24->mName).data,p_Var31[0x13]._M_prev,(size_t)p_Var34);
            (paVar24->mName).data[(long)p_Var34] = '\0';
          }
          p_Var34 = local_308;
          paVar24->mParent = local_318;
          paVar24->mNumMeshes = uVar16;
          if (uVar16 != 0) {
            puVar25 = (uint *)operator_new__((uVar40 & 0xffffffff) << 2);
            paVar24->mMeshes = puVar25;
            uVar40 = 0;
            do {
              paVar24->mMeshes[uVar40] = (int)local_300 + (int)uVar40;
              uVar40 = uVar40 + 1;
            } while (uVar40 < paVar24->mNumMeshes);
          }
          ppaVar26 = std::
                     map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                     ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                                   *)&local_230,
                                  (key_type_conflict2 *)((long)&p_Var31[0x13]._M_next + 2));
          *ppaVar26 = paVar24;
        }
      }
      p_Var31 = (((_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                 &p_Var31->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var31 != p_Var34);
  }
  paVar14 = local_240;
  pLVar12 = local_370;
  if (local_230._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __src = local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    ppaVar41 = local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar40 = ((long)(local_370->mSurfaces->
                      super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_370->mSurfaces->
                      super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7;
      uVar16 = (uint)uVar40;
      local_240->mNumMaterials = uVar16;
      ppaVar27 = (aiMaterial **)operator_new__((uVar40 & 0xffffffff) << 3);
      paVar14->mMaterials = ppaVar27;
      if (uVar16 != 0) {
        lVar32 = 0;
        uVar40 = 0;
        do {
          this_02 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_02);
          paVar14->mMaterials[uVar40] = this_02;
          ConvertMaterial(pLVar12,(Surface *)
                                  ((long)&(((pLVar12->mSurfaces->
                                            super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->mName).
                                          _M_dataplus._M_p + lVar32),this_02);
          uVar40 = uVar40 + 1;
          lVar32 = lVar32 + 0x148;
        } while (uVar40 < paVar14->mNumMaterials);
        __src = local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start;
        ppaVar41 = local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      paVar14->mNumMeshes = (uint)((ulong)((long)ppaVar41 - (long)__src) >> 3);
      uVar40 = (long)ppaVar41 - (long)__src & 0x7fffffff8;
      __dest = (aiMesh **)operator_new__(uVar40);
      paVar14->mMeshes = __dest;
      memcpy(__dest,__src,uVar40);
      GenerateNodeGraph(pLVar12,(map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                                 *)&local_230);
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
      ::~_Rb_tree(&local_230);
      if (local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_258._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_258._0_8_,(long)local_248 - local_258._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::~vector
                ((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *)local_2e8);
      std::__cxx11::_List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::_M_clear
                (&local_200);
      if ((int *)local_2b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start != (int *)0x0) {
        operator_delete(local_2b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      (**(code **)(*plVar29 + 8))(plVar29);
      return;
    }
  }
  prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"LWO: No meshes loaded","");
  std::runtime_error::runtime_error(prVar28,(string *)local_1e8);
  *(undefined ***)prVar28 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene,
    IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open LWO file " + pFile + ".");

    if((this->fileSize = (unsigned int)file->FileSize()) < 12)
        throw DeadlyImportError("LWO: The file is too small to contain the IFF header");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< uint8_t > mBuffer(fileSize);
    file->Read( &mBuffer[0], 1, fileSize);
    this->pScene = pScene;

    // Determine the type of the file
    uint32_t fileType;
    const char* sz = IFF::ReadHeader(&mBuffer[0],fileType);
    if (sz)throw DeadlyImportError(sz);

    mFileBuffer = &mBuffer[0] + 12;
    fileSize -= 12;

    // Initialize some members with their default values
    hasNamedLayer   = false;

    // Create temporary storage on the stack but store pointers to it in the class
    // instance. Therefore everything will be destructed properly if an exception
    // is thrown and we needn't take care of that.
    LayerList       _mLayers;
    SurfaceList     _mSurfaces;
    TagList         _mTags;
    TagMappingTable _mMapping;

    mLayers         = &_mLayers;
    mTags           = &_mTags;
    mMapping        = &_mMapping;
    mSurfaces       = &_mSurfaces;

    // Allocate a default layer (layer indices are 1-based from now)
    mLayers->push_back(Layer());
    mCurLayer = &mLayers->back();
    mCurLayer->mName = "<LWODefault>";
    mCurLayer->mIndex = -1;

    // old lightwave file format (prior to v6)
    if (AI_LWO_FOURCC_LWOB == fileType) {
        ASSIMP_LOG_INFO("LWO file format: LWOB (<= LightWave 5.5)");

        mIsLWO2 = false;
        mIsLXOB = false;
        LoadLWOBFile();
    }
    // New lightwave format
    else if (AI_LWO_FOURCC_LWO2 == fileType)    {
        mIsLXOB = false;
        ASSIMP_LOG_INFO("LWO file format: LWO2 (>= LightWave 6)");
    }
    // MODO file format
    else if (AI_LWO_FOURCC_LXOB == fileType)    {
        mIsLXOB = true;
        ASSIMP_LOG_INFO("LWO file format: LXOB (Modo)");
    }
    // we don't know this format
    else
    {
        char szBuff[5];
        szBuff[0] = (char)(fileType >> 24u);
        szBuff[1] = (char)(fileType >> 16u);
        szBuff[2] = (char)(fileType >> 8u);
        szBuff[3] = (char)(fileType);
        szBuff[4] = '\0';
        throw DeadlyImportError(std::string("Unknown LWO sub format: ") + szBuff);
    }

    if (AI_LWO_FOURCC_LWOB != fileType) {
        mIsLWO2 = true;
        LoadLWO2File();

        // The newer lightwave format allows the user to configure the
        // loader that just one layer is used. If this is the case
        // we need to check now whether the requested layer has been found.
        if (UINT_MAX != configLayerIndex) {
            unsigned int layerCount = 0;
            for(std::list<LWO::Layer>::iterator itLayers=mLayers->begin(); itLayers!=mLayers->end(); ++itLayers)
                if (!itLayers->skip)
                    layerCount++;
            if (layerCount!=2)
                throw DeadlyImportError("LWO2: The requested layer was not found");
        }

        if (configLayerName.length() && !hasNamedLayer) {
            throw DeadlyImportError("LWO2: Unable to find the requested layer: "
                + configLayerName);
        }
    }

    // now, as we have loaded all data, we can resolve cross-referenced tags and clips
    ResolveTags();
    ResolveClips();

    // now process all layers and build meshes and nodes
    std::vector<aiMesh*> apcMeshes;
    std::map<uint16_t, aiNode*> apcNodes;

    apcMeshes.reserve(mLayers->size()*std::min(((unsigned int)mSurfaces->size()/2u), 1u));

    unsigned int iDefaultSurface = UINT_MAX; // index of the default surface
	for (LWO::Layer &layer : *mLayers) {
        if (layer.skip)
            continue;

        // I don't know whether there could be dummy layers, but it would be possible
        const unsigned int meshStart = (unsigned int)apcMeshes.size();
        if (!layer.mFaces.empty() && !layer.mTempPoints.empty())    {

            // now sort all faces by the surfaces assigned to them
            std::vector<SortedRep> pSorted(mSurfaces->size()+1);

            unsigned int i = 0;
            for (FaceList::iterator it = layer.mFaces.begin(), end = layer.mFaces.end();it != end;++it,++i) {
                // Check whether we support this face's type
                if ((*it).type != AI_LWO_FACE && (*it).type != AI_LWO_PTCH &&
                    (*it).type != AI_LWO_BONE && (*it).type != AI_LWO_SUBD) {
                    continue;
                }

                unsigned int idx = (*it).surfaceIndex;
                if (idx >= mTags->size())
                {
                    ASSIMP_LOG_WARN("LWO: Invalid face surface index");
                    idx = UINT_MAX;
                }
                if(UINT_MAX == idx || UINT_MAX == (idx = _mMapping[idx]))   {
                    if (UINT_MAX == iDefaultSurface)    {
                        iDefaultSurface = (unsigned int)mSurfaces->size();
                        mSurfaces->push_back(LWO::Surface());
                        LWO::Surface& surf = mSurfaces->back();
                        surf.mColor.r = surf.mColor.g = surf.mColor.b = 0.6f;
                        surf.mName = "LWODefaultSurface";
                    }
                    idx = iDefaultSurface;
                }
                pSorted[idx].push_back(i);
            }
            if (UINT_MAX == iDefaultSurface) {
                pSorted.erase(pSorted.end()-1);
            }
            for (unsigned int p = 0,i = 0;i < mSurfaces->size();++i)    {
                SortedRep& sorted = pSorted[i];
                if (sorted.empty())
                    continue;

                // generate the mesh
                aiMesh* mesh = new aiMesh();
                apcMeshes.push_back(mesh);
                mesh->mNumFaces = (unsigned int)sorted.size();

                // count the number of vertices
                SortedRep::const_iterator it = sorted.begin(), end = sorted.end();
                for (;it != end;++it)   {
                    mesh->mNumVertices += layer.mFaces[*it].mNumIndices;
                }

                aiVector3D *nrm = NULL, * pv = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                aiFace* pf = mesh->mFaces = new aiFace[mesh->mNumFaces];
                mesh->mMaterialIndex = i;

                // find out which vertex color channels and which texture coordinate
                // channels are really required by the material attached to this mesh
                unsigned int vUVChannelIndices[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                unsigned int vVColorIndices[AI_MAX_NUMBER_OF_COLOR_SETS];

#ifdef ASSIMP_BUILD_DEBUG
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    vUVChannelIndices[mui] = UINT_MAX;
                }
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui ) {
                    vVColorIndices[mui] = UINT_MAX;
                }
#endif

                FindUVChannels(_mSurfaces[i],sorted,layer,vUVChannelIndices);
                FindVCChannels(_mSurfaces[i],sorted,layer,vVColorIndices);

                // allocate storage for UV and CV channels
                aiVector3D* pvUV[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    if (UINT_MAX == vUVChannelIndices[mui]) {
                        break;
                    }

                    pvUV[mui] = mesh->mTextureCoords[mui] = new aiVector3D[mesh->mNumVertices];

                    // LightWave doesn't support more than 2 UV components (?)
                    mesh->mNumUVComponents[0] = 2;
                }

                if (layer.mNormals.name.length())
                    nrm = mesh->mNormals = new aiVector3D[mesh->mNumVertices];

                aiColor4D* pvVC[AI_MAX_NUMBER_OF_COLOR_SETS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui) {
                    if (UINT_MAX == vVColorIndices[mui]) {
                        break;
                    }
                    pvVC[mui] = mesh->mColors[mui] = new aiColor4D[mesh->mNumVertices];
                }

                // we would not need this extra array, but the code is much cleaner if we use it
                std::vector<unsigned int>& smoothingGroups = layer.mPointReferrers;
                smoothingGroups.erase (smoothingGroups.begin(),smoothingGroups.end());
                smoothingGroups.resize(mesh->mNumFaces,0);

                // now convert all faces
                unsigned int vert = 0;
                std::vector<unsigned int>::iterator outIt = smoothingGroups.begin();
                for (it = sorted.begin(); it != end;++it,++outIt)   {
                    const LWO::Face& face = layer.mFaces[*it];
                    *outIt = face.smoothGroup;

                    // copy all vertices
                    for (unsigned int q = 0; q  < face.mNumIndices;++q,++vert)  {
                        unsigned int idx = face.mIndices[q];
                        *pv++ = layer.mTempPoints[idx] /*- layer.mPivot*/;

                        // process UV coordinates
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_TEXTURECOORDS;++w)    {
                            if (UINT_MAX == vUVChannelIndices[w]) {
                                break;
                            }
                            aiVector3D*& pp = pvUV[w];
                            const aiVector2D& src = ((aiVector2D*)&layer.mUVChannels[vUVChannelIndices[w]].rawData[0])[idx];
                            pp->x = src.x;
                            pp->y = src.y;
                            pp++;
                        }

                        // process normals (MODO extension)
                        if (nrm)    {
                            *nrm = ((aiVector3D*)&layer.mNormals.rawData[0])[idx];
                            nrm->z *= -1.f;
                            ++nrm;
                        }

                        // process vertex colors
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_COLOR_SETS;++w)   {
                            if (UINT_MAX == vVColorIndices[w]) {
                                break;
                            }
                            *pvVC[w] = ((aiColor4D*)&layer.mVColorChannels[vVColorIndices[w]].rawData[0])[idx];

                            // If a RGB color map is explicitly requested delete the
                            // alpha channel - it could theoretically be != 1.
                            if(_mSurfaces[i].mVCMapType == AI_LWO_RGB)
                                pvVC[w]->a = 1.f;

                            pvVC[w]++;
                        }

#if 0
                        // process vertex weights. We can't properly reconstruct the whole skeleton for now,
                        // but we can create dummy bones for all weight channels which we have.
                        for (unsigned int w = 0; w < layer.mWeightChannels.size();++w)
                        {
                        }
#endif

                        face.mIndices[q] = vert;
                    }
                    pf->mIndices = face.mIndices;
                    pf->mNumIndices = face.mNumIndices;
                    unsigned int** p = (unsigned int**)&face.mIndices;*p = NULL; // HACK: make sure it won't be deleted
                    pf++;
                }

                if (!mesh->mNormals)    {
                    // Compute normal vectors for the mesh - we can't use our GenSmoothNormal-
                    // Step here since it wouldn't handle smoothing groups correctly for LWO.
                    // So we use a separate implementation.
                    ComputeNormals(mesh,smoothingGroups,_mSurfaces[i]);
                }
                else {
                    ASSIMP_LOG_DEBUG("LWO2: No need to compute normals, they're already there");
                }
                ++p;
            }
        }

        // Generate nodes to render the mesh. Store the source layer in the mParent member of the nodes
        unsigned int num = static_cast<unsigned int>(apcMeshes.size() - meshStart);
        if (layer.mName != "<LWODefault>" || num > 0) {
            aiNode* pcNode = new aiNode();
            pcNode->mName.Set(layer.mName);
            pcNode->mParent = (aiNode*)&layer;
            pcNode->mNumMeshes = num;

            if (pcNode->mNumMeshes) {
                pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
                for (unsigned int p = 0; p < pcNode->mNumMeshes;++p)
                    pcNode->mMeshes[p] = p + meshStart;
            }
            apcNodes[layer.mIndex] = pcNode;
        }
    }

    if (apcNodes.empty() || apcMeshes.empty())
        throw DeadlyImportError("LWO: No meshes loaded");

    // The RemoveRedundantMaterials step will clean this up later
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = (unsigned int)mSurfaces->size()];
    for (unsigned int mat = 0; mat < pScene->mNumMaterials;++mat)   {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[mat] = pcMat;
        ConvertMaterial((*mSurfaces)[mat],pcMat);
    }

    // copy the meshes to the output structure
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes = (unsigned int)apcMeshes.size() ];
    ::memcpy(pScene->mMeshes,&apcMeshes[0],pScene->mNumMeshes*sizeof(void*));

    // generate the final node graph
    GenerateNodeGraph(apcNodes);
}